

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O0

void pfd_receive(Plug *plug,int urgent,char *data,size_t len)

{
  char cVar1;
  bool bVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uint ipv4_00;
  uint uVar6;
  unsigned_long uVar7;
  BinarySource *pBVar8;
  strbuf *psVar9;
  SshChannel *pSVar10;
  ptrlen pVar11;
  char *local_120;
  ulong uStack_d8;
  uchar this_method;
  size_t i;
  ulong local_c8;
  _Bool name_based;
  strbuf *output;
  char *socks4_hostname;
  ptrlen methods;
  uint method;
  uint ipv4;
  uint port;
  uint reply_code;
  uint reserved_byte;
  uint message_type;
  uint socks_version;
  undefined1 local_58 [8];
  BinarySource src [1];
  PortForwarding *pf;
  size_t len_local;
  char *data_local;
  int urgent_local;
  Plug *plug_local;
  
  src[0].binarysource_ = (BinarySource *)(plug + -8);
  if (len != 0) {
    if (*(int *)((long)&plug[-5].vt + 4) != 0) {
      BinarySink_put_data((BinarySink *)&(plug[-2].vt)->sent,data,len);
      if (*(int *)&(src[0].binarysource_)->field_0x1c == 1) {
        cVar1 = **(char **)(src[0].binarysource_[1].pos + 8);
        if (cVar1 == '\x04') {
          *(undefined4 *)&(src[0].binarysource_)->field_0x1c = 2;
        }
        else {
          if (cVar1 != '\x05') {
            pfd_close((PortForwarding *)src[0].binarysource_);
            return;
          }
          *(undefined4 *)&(src[0].binarysource_)->field_0x1c = 3;
        }
      }
      pVar11 = make_ptrlen(*(void **)(src[0].binarysource_[1].pos + 8),
                           *(size_t *)(src[0].binarysource_[1].pos + 0x10));
      BinarySource_INIT__((BinarySource *)local_58,pVar11);
      BinarySource_get_data((BinarySource *)src[0]._24_8_,src[0].binarysource_[1].len);
      do {
        if (*(int *)&(src[0].binarysource_)->field_0x1c == 0) {
          sk_set_frozen((Socket *)(src[0].binarysource_)->len,true);
          pSVar10 = wrap_lportfwd_open((ConnectionLayer *)(src[0].binarysource_)->pos,
                                       (char *)(src[0].binarysource_)->binarysource_,
                                       *(int *)&src[0].binarysource_[1].data,
                                       (Socket *)(src[0].binarysource_)->len,
                                       (Channel *)&src[0].binarysource_[1].binarysource_);
          (src[0].binarysource_)->data = pSVar10;
          break;
        }
        switch(*(undefined4 *)&(src[0].binarysource_)->field_0x1c) {
        case 1:
          __assert_fail("false && \"These case values cannot appear\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/portfwd.c"
                        ,0xf5,"void pfd_receive(Plug *, int, const char *, size_t)");
        case 2:
          uVar3 = BinarySource_get_byte((BinarySource *)src[0]._24_8_);
          uVar4 = BinarySource_get_byte((BinarySource *)src[0]._24_8_);
          if (*(int *)(src[0]._24_8_ + 0x18) == 1) {
            return;
          }
          if ((uVar3 == '\x04') && (uVar4 == '\x01')) {
            bVar2 = false;
            uVar6 = BinarySource_get_uint16((BinarySource *)src[0]._24_8_);
            uVar7 = BinarySource_get_uint32((BinarySource *)src[0]._24_8_);
            ipv4_00 = (uint)uVar7;
            if ((ipv4_00 != 0) && (ipv4_00 < 0x100)) {
              bVar2 = true;
            }
            BinarySource_get_asciz((BinarySource *)src[0]._24_8_);
            if (bVar2) {
              local_120 = BinarySource_get_asciz((BinarySource *)src[0]._24_8_);
            }
            else {
              local_120 = (char *)0x0;
            }
            if (*(int *)(src[0]._24_8_ + 0x18) == 1) {
              return;
            }
            if (*(int *)(src[0]._24_8_ + 0x18) == 0) {
              *(uint *)&src[0].binarysource_[1].data = uVar6;
              if (bVar2) {
                pBVar8 = (BinarySource *)dupstr(local_120);
                (src[0].binarysource_)->binarysource_ = pBVar8;
              }
              else {
                pBVar8 = (BinarySource *)ipv4_to_string(ipv4_00);
                (src[0].binarysource_)->binarysource_ = pBVar8;
              }
              psVar9 = strbuf_new();
              BinarySink_put_byte(psVar9->binarysink_,'\0');
              BinarySink_put_byte(psVar9->binarysink_,'Z');
              BinarySink_put_uint16(psVar9->binarysink_,0);
              BinarySink_put_uint32(psVar9->binarysink_,0);
              sk_write((Socket *)(src[0].binarysource_)->len,psVar9->u,psVar9->len);
              strbuf_free(psVar9);
              *(undefined4 *)&(src[0].binarysource_)->field_0x1c = 0;
              src[0].binarysource_[1].len = (size_t)src[0].data;
              break;
            }
          }
          psVar9 = strbuf_new();
          BinarySink_put_byte(psVar9->binarysink_,'\0');
          BinarySink_put_byte(psVar9->binarysink_,'[');
          BinarySink_put_uint16(psVar9->binarysink_,0);
          BinarySink_put_uint32(psVar9->binarysink_,0);
          sk_write((Socket *)(src[0].binarysource_)->len,psVar9->u,psVar9->len);
          strbuf_free(psVar9);
          pfd_close((PortForwarding *)src[0].binarysource_);
          return;
        case 3:
          BinarySource_get_byte((BinarySource *)src[0]._24_8_);
          pVar11 = BinarySource_get_pstring((BinarySource *)src[0]._24_8_);
          i = (size_t)pVar11.ptr;
          local_c8 = pVar11.len;
          uVar3 = 0xff;
          for (uStack_d8 = 0; uStack_d8 < local_c8; uStack_d8 = uStack_d8 + 1) {
            if (*(char *)(i + uStack_d8) == '\0') {
              uVar3 = '\0';
              break;
            }
          }
          if (*(int *)(src[0]._24_8_ + 0x18) == 1) {
            return;
          }
          if (*(int *)(src[0]._24_8_ + 0x18) != 0) {
            uVar3 = 0xff;
          }
          psVar9 = strbuf_new();
          BinarySink_put_byte(psVar9->binarysink_,'\x05');
          BinarySink_put_byte(psVar9->binarysink_,uVar3);
          sk_write((Socket *)(src[0].binarysource_)->len,psVar9->u,psVar9->len);
          strbuf_free(psVar9);
          if (uVar3 == 0xff) {
            pfd_close((PortForwarding *)src[0].binarysource_);
            return;
          }
          *(undefined4 *)&(src[0].binarysource_)->field_0x1c = 4;
          src[0].binarysource_[1].len = (size_t)src[0].data;
          break;
        case 4:
          uVar3 = BinarySource_get_byte((BinarySource *)src[0]._24_8_);
          uVar4 = BinarySource_get_byte((BinarySource *)src[0]._24_8_);
          uVar5 = BinarySource_get_byte((BinarySource *)src[0]._24_8_);
          if (((uVar3 == '\x05') && (uVar4 == '\x01')) && (uVar5 == '\0')) {
            ipv4 = 0;
            uVar3 = BinarySource_get_byte((BinarySource *)src[0]._24_8_);
            if (uVar3 == '\x01') {
              uVar7 = BinarySource_get_uint32((BinarySource *)src[0]._24_8_);
              pBVar8 = (BinarySource *)ipv4_to_string((uint)uVar7);
              (src[0].binarysource_)->binarysource_ = pBVar8;
            }
            else if (uVar3 == '\x03') {
              pVar11 = BinarySource_get_pstring((BinarySource *)src[0]._24_8_);
              pBVar8 = (BinarySource *)mkstr(pVar11);
              (src[0].binarysource_)->binarysource_ = pBVar8;
            }
            else if (uVar3 == '\x04') {
              pVar11 = BinarySource_get_data((BinarySource *)src[0]._24_8_,0x10);
              pBVar8 = (BinarySource *)ipv6_to_string(pVar11);
              (src[0].binarysource_)->binarysource_ = pBVar8;
            }
            else {
              (src[0].binarysource_)->binarysource_ = (BinarySource *)0x0;
              ipv4 = 8;
            }
            uVar6 = BinarySource_get_uint16((BinarySource *)src[0]._24_8_);
            *(uint *)&src[0].binarysource_[1].data = uVar6;
          }
          else {
            ipv4 = 7;
          }
          if (*(int *)(src[0]._24_8_ + 0x18) == 1) {
            return;
          }
          if (*(int *)(src[0]._24_8_ + 0x18) != 0) {
            ipv4 = 1;
          }
          psVar9 = strbuf_new();
          BinarySink_put_byte(psVar9->binarysink_,'\x05');
          BinarySink_put_byte(psVar9->binarysink_,(uchar)ipv4);
          BinarySink_put_byte(psVar9->binarysink_,'\0');
          BinarySink_put_byte(psVar9->binarysink_,'\x01');
          BinarySink_put_uint32(psVar9->binarysink_,0);
          BinarySink_put_uint16(psVar9->binarysink_,0);
          sk_write((Socket *)(src[0].binarysource_)->len,psVar9->u,psVar9->len);
          strbuf_free(psVar9);
          if (ipv4 != 0) {
            pfd_close((PortForwarding *)src[0].binarysource_);
            return;
          }
          *(undefined4 *)&(src[0].binarysource_)->field_0x1c = 0;
          src[0].binarysource_[1].len = (size_t)src[0].data;
        }
      } while( true );
    }
    if (((src[0].binarysource_)->err & 0x100) != BSE_NO_ERROR) {
      sshfwd_write((SshChannel *)(src[0].binarysource_)->data,data,len);
    }
  }
  return;
}

Assistant:

static void pfd_receive(Plug *plug, int urgent, const char *data, size_t len)
{
    struct PortForwarding *pf =
        container_of(plug, struct PortForwarding, plug);

    if (len == 0)
        return;

    if (pf->socks_state != SOCKS_NONE) {
        BinarySource src[1];

        /*
         * Store all the data we've got in socksbuf.
         */
        put_data(pf->socksbuf, data, len);

        /*
         * Check the start of socksbuf to see if it's a valid and
         * complete message in the SOCKS exchange.
         */

        if (pf->socks_state == SOCKS_INITIAL) {
            /* Preliminary: check the first byte of the data (which we
             * _must_ have by now) to find out which SOCKS major
             * version we're speaking. */
            switch (pf->socksbuf->u[0]) {
              case SOCKS4_REQUEST_VERSION:
                pf->socks_state = SOCKS_4;
                break;
              case SOCKS5_REQUEST_VERSION:
                pf->socks_state = SOCKS_5_INITIAL;
                break;
              default:
                pfd_close(pf);         /* unrecognised version */
                return;
            }
        }

        BinarySource_BARE_INIT(src, pf->socksbuf->u, pf->socksbuf->len);
        get_data(src, pf->socksbuf_consumed);

        while (pf->socks_state != SOCKS_NONE) {
            unsigned socks_version, message_type, reserved_byte;
            unsigned reply_code, port, ipv4, method;
            ptrlen methods;
            const char *socks4_hostname;
            strbuf *output;

            switch (pf->socks_state) {
              case SOCKS_INITIAL:
              case SOCKS_NONE:
                unreachable("These case values cannot appear");

              case SOCKS_4:
                /* SOCKS 4/4A connect message */
                socks_version = get_byte(src);
                message_type = get_byte(src);

                if (get_err(src) == BSE_OUT_OF_DATA)
                    return;
                if (socks_version == SOCKS4_REQUEST_VERSION &&
                    message_type == SOCKS_CMD_CONNECT) {
                    /* CONNECT message */
                    bool name_based = false;

                    port = get_uint16(src);
                    ipv4 = get_uint32(src);
                    if (ipv4 >= SOCKS4A_NAME_FOLLOWS_BASE &&
                        ipv4 < SOCKS4A_NAME_FOLLOWS_LIMIT) {
                        /*
                         * Addresses in this range indicate the SOCKS 4A
                         * extension to specify a hostname, which comes
                         * after the username.
                         */
                        name_based = true;
                    }
                    get_asciz(src);        /* skip username */
                    socks4_hostname = name_based ? get_asciz(src) : NULL;

                    if (get_err(src) == BSE_OUT_OF_DATA)
                        return;
                    if (get_err(src))
                        goto socks4_reject;

                    pf->port = port;
                    if (name_based) {
                        pf->hostname = dupstr(socks4_hostname);
                    } else {
                        pf->hostname = ipv4_to_string(ipv4);
                    }

                    output = strbuf_new();
                    put_byte(output, SOCKS4_REPLY_VERSION);
                    put_byte(output, SOCKS4_RESP_SUCCESS);
                    put_uint16(output, 0);     /* null port field */
                    put_uint32(output, 0);     /* null address field */
                    sk_write(pf->s, output->u, output->len);
                    strbuf_free(output);

                    pf->socks_state = SOCKS_NONE;
                    pf->socksbuf_consumed = src->pos;
                    break;
                }

              socks4_reject:
                output = strbuf_new();
                put_byte(output, SOCKS4_REPLY_VERSION);
                put_byte(output, SOCKS4_RESP_FAILURE);
                put_uint16(output, 0);     /* null port field */
                put_uint32(output, 0);     /* null address field */
                sk_write(pf->s, output->u, output->len);
                strbuf_free(output);
                pfd_close(pf);
                return;

              case SOCKS_5_INITIAL:
                /* SOCKS 5 initial method list */
                socks_version = get_byte(src);
                methods = get_pstring(src);

                method = SOCKS5_AUTH_REJECTED;

                /* Search the method list for AUTH_NONE, which is the
                 * only one this client code can speak */
                for (size_t i = 0; i < methods.len; i++) {
                    unsigned char this_method =
                        ((const unsigned char *)methods.ptr)[i];
                    if (this_method == SOCKS5_AUTH_NONE) {
                        method = this_method;
                        break;
                    }
                }

                if (get_err(src) == BSE_OUT_OF_DATA)
                    return;
                if (get_err(src))
                    method = SOCKS5_AUTH_REJECTED;

                output = strbuf_new();
                put_byte(output, SOCKS5_REPLY_VERSION);
                put_byte(output, method);
                sk_write(pf->s, output->u, output->len);
                strbuf_free(output);

                if (method == SOCKS5_AUTH_REJECTED) {
                    pfd_close(pf);
                    return;
                }

                pf->socks_state = SOCKS_5_CONNECT;
                pf->socksbuf_consumed = src->pos;
                break;

              case SOCKS_5_CONNECT:
                /* SOCKS 5 connect message */
                socks_version = get_byte(src);
                message_type = get_byte(src);
                reserved_byte = get_byte(src);

                if (socks_version == SOCKS5_REQUEST_VERSION &&
                    message_type == SOCKS_CMD_CONNECT &&
                    reserved_byte == 0) {

                    reply_code = SOCKS5_RESP_SUCCESS;

                    switch (get_byte(src)) {
                      case SOCKS5_ADDR_IPV4:
                        pf->hostname = ipv4_to_string(get_uint32(src));
                        break;
                      case SOCKS5_ADDR_IPV6:
                        pf->hostname = ipv6_to_string(get_data(src, 16));
                        break;
                      case SOCKS5_ADDR_HOSTNAME:
                        pf->hostname = mkstr(get_pstring(src));
                        break;
                      default:
                        pf->hostname = NULL;
                        reply_code = SOCKS5_RESP_ADDRTYPE_NOT_SUPPORTED;
                        break;
                    }

                    pf->port = get_uint16(src);
                } else {
                    reply_code = SOCKS5_RESP_COMMAND_NOT_SUPPORTED;
                }

                if (get_err(src) == BSE_OUT_OF_DATA)
                    return;
                if (get_err(src))
                    reply_code = SOCKS5_RESP_FAILURE;

                output = strbuf_new();
                put_byte(output, SOCKS5_REPLY_VERSION);
                put_byte(output, reply_code);
                put_byte(output, 0);       /* reserved */
                put_byte(output, SOCKS5_ADDR_IPV4); /* IPv4 address follows */
                put_uint32(output, 0);     /* bound IPv4 address (unused) */
                put_uint16(output, 0);     /* bound port number (unused) */
                sk_write(pf->s, output->u, output->len);
                strbuf_free(output);

                if (reply_code != SOCKS5_RESP_SUCCESS) {
                    pfd_close(pf);
                    return;
                }

                pf->socks_state = SOCKS_NONE;
                pf->socksbuf_consumed = src->pos;
                break;
            }
        }

        /*
         * We come here when we're ready to make an actual
         * connection.
         */

        /*
         * Freeze the socket until the SSH server confirms the
         * connection.
         */
        sk_set_frozen(pf->s, true);

        pf->c = wrap_lportfwd_open(pf->cl, pf->hostname, pf->port, pf->s,
                                   &pf->chan);
    }
    if (pf->ready)
        sshfwd_write(pf->c, data, len);
}